

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toc.c
# Opt level: O0

int cueify_toc_deserialize(cueify_toc *t,uint8_t *buffer,size_t size)

{
  ushort uVar1;
  byte local_41;
  uint8_t *puStack_40;
  uint8_t offset;
  uint8_t *bp;
  uint16_t toc_length;
  cueify_toc_private *toc;
  size_t size_local;
  uint8_t *buffer_local;
  cueify_toc *t_local;
  
  if ((t == (cueify_toc *)0x0) || (buffer == (uint8_t *)0x0)) {
    t_local._4_4_ = 3;
  }
  else if (size < 4) {
    t_local._4_4_ = 6;
  }
  else {
    uVar1 = CONCAT11(*buffer,buffer[1]);
    if (size - 2 < (ulong)uVar1) {
      t_local._4_4_ = 6;
    }
    else if ((int)(uVar1 - 2) % 8 == 0) {
      memset(t,0,0x324);
      *(uint8_t *)t = buffer[2];
      *(uint8_t *)((long)t + 1) = buffer[3];
      for (puStack_40 = buffer + 4; puStack_40 < buffer + (long)(int)(uint)uVar1 + 2;
          puStack_40 = puStack_40 + 8) {
        local_41 = puStack_40[2];
        if (local_41 == 0xaa) {
          local_41 = 0;
        }
        *(char *)((long)t + (ulong)local_41 * 8 + 4) = (char)((int)(uint)puStack_40[1] >> 4);
        *(byte *)((long)t + (ulong)local_41 * 8 + 5) = puStack_40[1] & 0xf;
        *(uint *)(t + (ulong)local_41 + 1) =
             (uint)puStack_40[4] << 0x18 | (uint)puStack_40[5] << 0x10 | (uint)puStack_40[6] << 8 |
             (uint)puStack_40[7];
      }
      t_local._4_4_ = 0;
    }
    else {
      t_local._4_4_ = 7;
    }
  }
  return t_local._4_4_;
}

Assistant:

int cueify_toc_deserialize(cueify_toc *t, const uint8_t * const buffer,
			   size_t size) {
    cueify_toc_private *toc = (cueify_toc_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    uint8_t offset;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* TOC Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 8 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    memset(toc, 0, sizeof(cueify_toc_private));

    /* First Track Number */
    toc->first_track_number = buffer[2];
    /* Last Track Number */
    toc->last_track_number = buffer[3];

    /* TOC Track Descriptor(s) */
    bp = buffer + 4;
    while (bp < buffer + toc_length + 2) {
	/* Track Number */
	offset = bp[2];
	if (offset == 0xAA) {
	    offset = 0;
	}

	/* Reserved */
	bp++;
	/* ADR */
	toc->tracks[offset].adr = *bp >> 4;
	/* CONTROL */
	toc->tracks[offset].control = *bp & 0xF;
	bp++;
	/* Track Number */
	bp++;
	/* Reserved */
	bp++;
	/* Track Start Address (LBA) */
	toc->tracks[offset].lba = ((bp[0] << 24) |
				   (bp[1] << 16) |
				   (bp[2] << 8)  | 
				   (bp[3]));
	bp += 4;
    }

    return CUEIFY_OK;
}